

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

bool __thiscall flatbuffers::StructDef::Deserialize(StructDef *this,Parser *parser,Object *object)

{
  SymbolTable<flatbuffers::Value> *attributes;
  bool bVar1;
  bool bVar2;
  uint16_t uVar3;
  int32_t iVar4;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *attrs;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *documentation;
  String *this_00;
  Value *pVVar5;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *this_01;
  return_type pFVar6;
  FieldDef *this_02;
  size_t sVar7;
  size_t sVar8;
  byte bVar9;
  uoffset_t i;
  uint i_00;
  ulong uVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  long local_90;
  string local_88;
  Object *local_68;
  SymbolTable<flatbuffers::FieldDef> *local_60;
  Parser *local_58;
  string local_50;
  
  attrs = reflection::Object::attributes(object);
  attributes = &(this->super_Definition).attributes;
  bVar1 = DeserializeAttributesCommon(attributes,parser,attrs);
  if (bVar1) {
    documentation = reflection::Object::documentation(object);
    anon_unknown_0::DeserializeDoc(&(this->super_Definition).doc_comment,documentation);
    this_00 = reflection::Object::name(object);
    String::str_abi_cxx11_(&local_50,this_00);
    Parser::UnqualifiedName(&local_88,parser,&local_50);
    std::__cxx11::string::operator=((string *)this,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_50);
    this->predecl = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"original_order",(allocator<char> *)&local_50);
    local_58 = parser;
    pVVar5 = SymbolTable<flatbuffers::Value>::Lookup(attributes,&local_88);
    bVar9 = this->fixed ^ 1;
    i_00 = 0;
    if (pVVar5 != (Value *)0x0) {
      bVar9 = false;
    }
    this->sortbysize = (bool)bVar9;
    std::__cxx11::string::~string((string *)&local_88);
    this_01 = reflection::Object::fields(object);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,
               (ulong)*(uint *)this_01,(allocator_type *)&local_50);
    for (; i_00 < *(uint *)this_01; i_00 = i_00 + 1) {
      pFVar6 = Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>::Get(this_01,i_00);
      uVar3 = reflection::Field::id(pFVar6);
      *(uint *)(local_88._M_dataplus._M_p + (ulong)uVar3 * 4) = i_00;
    }
    local_60 = &this->fields;
    local_90 = 0;
    uVar10 = 0;
    local_68 = object;
    while (bVar1 = (ulong)((long)(local_88._M_string_length - (long)local_88._M_dataplus._M_p) >> 2)
                   <= uVar10, !bVar1) {
      pFVar6 = Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>::Get
                         (this_01,*(uint *)(local_88._M_dataplus._M_p + uVar10 * 4));
      this_02 = (FieldDef *)operator_new(0x138);
      FieldDef::FieldDef(this_02);
      bVar2 = FieldDef::Deserialize(this_02,local_58,pFVar6);
      if ((!bVar2) ||
         (bVar2 = SymbolTable<flatbuffers::FieldDef>::Add(local_60,(string *)this_02,this_02), bVar2
         )) {
LAB_0011a6b3:
        FieldDef::~FieldDef(this_02);
        operator_delete(this_02,0x138);
        goto LAB_0011a6da;
      }
      if (this_02->key == true) {
        if (this->has_key != false) goto LAB_0011a6b3;
        this->has_key = true;
      }
      if (this->fixed == false) {
        uVar10 = uVar10 + 1;
      }
      else {
        sVar7 = InlineSize(&(this_02->value).type);
        if ((uVar10 + 1 <
             (ulong)((long)(local_88._M_string_length - (long)local_88._M_dataplus._M_p) >> 2)) &&
           (pFVar6 = Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>::Get
                               (this_01,*(uint *)(local_88._M_dataplus._M_p + uVar10 * 4 + 4)),
           pFVar6 != (return_type)0x0)) {
          uVar3 = reflection::Field::offset(pFVar6);
          sVar8 = (ulong)uVar3 - (sVar7 + (this_02->value).offset);
        }
        else {
          sVar8 = this->minalign - 1 & -(local_90 + sVar7);
        }
        this_02->padding = sVar8;
        local_90 = local_90 + sVar7 + sVar8;
        uVar10 = uVar10 + 1;
      }
    }
    iVar4 = reflection::Object::bytesize(local_68);
    if (iVar4 != (int)local_90) {
      __assert_fail("static_cast<int>(tmp_struct_size) == object->bytesize()",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                    ,0xfc0,
                    "bool flatbuffers::StructDef::Deserialize(Parser &, const reflection::Object *)"
                   );
    }
LAB_0011a6da:
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool StructDef::Deserialize(Parser &parser, const reflection::Object *object) {
  if (!DeserializeAttributes(parser, object->attributes())) return false;
  DeserializeDoc(doc_comment, object->documentation());
  name = parser.UnqualifiedName(object->name()->str());
  predecl = false;
  sortbysize = attributes.Lookup("original_order") == nullptr && !fixed;
  const auto &of = *(object->fields());
  auto indexes = std::vector<uoffset_t>(of.size());
  for (uoffset_t i = 0; i < of.size(); i++) indexes[of.Get(i)->id()] = i;
  size_t tmp_struct_size = 0;
  for (size_t i = 0; i < indexes.size(); i++) {
    auto field = of.Get(indexes[i]);
    auto field_def = new FieldDef();
    if (!field_def->Deserialize(parser, field) ||
        fields.Add(field_def->name, field_def)) {
      delete field_def;
      return false;
    }
    if (field_def->key) {
      if (has_key) {
        // only one field may be set as key
        delete field_def;
        return false;
      }
      has_key = true;
    }
    if (fixed) {
      // Recompute padding since that's currently not serialized.
      auto size = InlineSize(field_def->value.type);
      auto next_field =
          i + 1 < indexes.size() ? of.Get(indexes[i + 1]) : nullptr;
      tmp_struct_size += size;
      field_def->padding =
          next_field ? (next_field->offset() - field_def->value.offset) - size
                     : PaddingBytes(tmp_struct_size, minalign);
      tmp_struct_size += field_def->padding;
    }
  }
  FLATBUFFERS_ASSERT(static_cast<int>(tmp_struct_size) == object->bytesize());
  return true;
}